

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O0

bool __thiscall
Omega_h::CmdLineItem::parse(CmdLineItem *this,int *p_argc,char **argv,int i,bool should_print)

{
  uint uVar1;
  ostream *poVar2;
  string *psVar3;
  bool ok;
  bool should_print_local;
  int i_local;
  char **argv_local;
  int *p_argc_local;
  CmdLineItem *this_local;
  
  if ((this->parsed_ & 1U) == 0) {
    uVar1 = (*this->_vptr_CmdLineItem[2])(this,p_argc,argv,(ulong)(uint)i,(ulong)should_print);
    this_local._7_1_ = (bool)((byte)uVar1 & 1);
    if ((uVar1 & 1) != 0) {
      this->parsed_ = true;
    }
  }
  else {
    if (should_print) {
      poVar2 = std::operator<<((ostream *)&std::cout,"argument <");
      psVar3 = name_abi_cxx11_(this);
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      std::operator<<(poVar2," being parsed twice!\n");
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CmdLineItem::parse(int* p_argc, char** argv, int i, bool should_print) {
  if (parsed_) {
    if (should_print) {
      std::cout << "argument <" << name() << " being parsed twice!\n";
    }
    return false;
  }
  auto ok = parse_impl(p_argc, argv, i, should_print);
  if (ok) parsed_ = true;
  return ok;
}